

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ScaleWindowsInViewport(ImGuiViewportP *viewport,float scale)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  uint uVar2;
  ulong uVar3;
  
  pIVar1 = GImGui;
  if (viewport->Window != (ImGuiWindow *)0x0) {
    ScaleWindow(viewport->Window,scale);
    return;
  }
  uVar2 = (GImGui->Windows).Size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if ((long)(int)uVar2 <= (long)uVar3) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar1->Windows).Data[uVar3];
      if (window->Viewport == viewport) {
        ScaleWindow(window,scale);
        uVar2 = (pIVar1->Windows).Size;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void ImGui::ScaleWindowsInViewport(ImGuiViewportP* viewport, float scale)
{
    ImGuiContext& g = *GImGui;
    if (viewport->Window)
    {
        ScaleWindow(viewport->Window, scale);
    }
    else
    {
        for (int i = 0; i != g.Windows.Size; i++)
            if (g.Windows[i]->Viewport == viewport)
                ScaleWindow(g.Windows[i], scale);
    }
}